

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_pack_data
              (nghttp2_session *session,nghttp2_bufs *bufs,size_t datamax,nghttp2_frame *frame,
              nghttp2_data_aux_data *aux_data,nghttp2_stream *stream)

{
  int iVar1;
  nghttp2_session *session_00;
  nghttp2_frame *frame_00;
  nghttp2_ssize nVar2;
  ulong *in_RCX;
  ulong in_RDX;
  long *in_RSI;
  long in_RDI;
  int *in_R8;
  long in_R9;
  size_t max_payloadlen;
  nghttp2_buf *buf;
  nghttp2_ssize padded_payloadlen;
  nghttp2_ssize payloadlen;
  uint32_t data_flags;
  int rv;
  nghttp2_stream *pnVar3;
  nghttp2_session *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int iVar4;
  ulong local_48;
  uint local_40;
  int local_3c;
  int *local_30;
  ulong *local_28;
  ulong local_20;
  long *local_18;
  long local_10;
  int local_4;
  
  if (*in_RSI != in_RSI[1]) {
    __assert_fail("bufs->head == bufs->cur",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                  ,0x1e0c,
                  "int nghttp2_session_pack_data(nghttp2_session *, nghttp2_bufs *, size_t, nghttp2_frame *, nghttp2_data_aux_data *, nghttp2_stream *)"
                 );
  }
  session_00 = (nghttp2_session *)(in_RSI[1] + 8);
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_10 = in_RDI;
  if ((*(long *)(in_RDI + 0x9c0) != 0) || (*(long *)(in_RDI + 0x9b8) != 0)) {
    local_18 = in_RSI;
    if (*(long *)(in_RDI + 0x9c0) == 0) {
      pnVar3 = *(nghttp2_stream **)(in_RDI + 0xa30);
      (**(code **)(in_RDI + 0x9b8))
                (in_RDI,*(undefined1 *)((long)in_RCX + 0xc),*(undefined4 *)(in_R9 + 0xa8),
                 *(undefined4 *)(in_RDI + 0xb0c),*(undefined4 *)(in_R9 + 0xac),
                 *(undefined4 *)(in_RDI + 0xb34));
    }
    else {
      pnVar3 = *(nghttp2_stream **)(in_RDI + 0xa30);
      (**(code **)(in_RDI + 0x9c0))
                (in_RDI,*(undefined1 *)((long)in_RCX + 0xc),*(undefined4 *)(in_R9 + 0xa8),
                 *(undefined4 *)(in_RDI + 0xb0c),*(undefined4 *)(in_R9 + 0xac),
                 *(undefined4 *)(in_RDI + 0xb34));
    }
    local_48 = nghttp2_session_enforce_flow_control_limits
                         (in_stack_ffffffffffffff90,pnVar3,0x11a079);
    if ((long)local_48 < 1) {
      return -0x386;
    }
    if ((long)(session_00->streams).mem - (session_00->streams).hashbits < local_48) {
      local_3c = nghttp2_bufs_realloc
                           ((nghttp2_bufs *)
                            CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                            (size_t)in_stack_ffffffffffffff90);
      if (local_3c == 0) {
        if ((long *)(local_10 + 0x290) != local_18) {
          __assert_fail("&session->aob.framebufs == bufs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                        ,0x1e37,
                        "int nghttp2_session_pack_data(nghttp2_session *, nghttp2_bufs *, size_t, nghttp2_frame *, nghttp2_data_aux_data *, nghttp2_stream *)"
                       );
        }
        session_00 = (nghttp2_session *)(local_18[1] + 8);
      }
      else {
        local_48 = local_20;
      }
    }
    local_20 = local_48;
  }
  if ((long)(session_00->streams).mem - (session_00->streams).hashbits < local_20) {
    __assert_fail("nghttp2_buf_avail(buf) >= datamax",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                  ,0x1e40,
                  "int nghttp2_session_pack_data(nghttp2_session *, nghttp2_bufs *, size_t, nghttp2_frame *, nghttp2_data_aux_data *, nghttp2_stream *)"
                 );
  }
  local_40 = 0;
  iVar4 = *local_30;
  if (iVar4 == 1) {
    pnVar3 = *(nghttp2_stream **)(local_10 + 0xa30);
    local_48 = (**(code **)(local_30 + 4))
                         (local_10,(int)local_28[1],(session_00->streams).size,local_20,&local_40,
                          local_30 + 2);
  }
  else {
    if (iVar4 != 2) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                    ,0x1e51,
                    "int nghttp2_session_pack_data(nghttp2_session *, nghttp2_bufs *, size_t, nghttp2_frame *, nghttp2_data_aux_data *, nghttp2_stream *)"
                   );
    }
    pnVar3 = *(nghttp2_stream **)(local_10 + 0xa30);
    local_48 = (**(code **)(local_30 + 4))
                         (local_10,(int)local_28[1],(session_00->streams).size,local_20,&local_40,
                          local_30 + 2);
  }
  if (((local_48 == 0xfffffffffffffe04) || (local_48 == 0xfffffffffffffdf7)) ||
     (local_48 == 0xfffffffffffffdf2)) {
    local_4 = (int)local_48;
  }
  else if (((long)local_48 < 0) || (local_20 < local_48)) {
    local_4 = -0x386;
  }
  else {
    (session_00->streams).hashbits = (session_00->streams).size + local_48;
    (session_00->streams).size = (session_00->streams).size - 9;
    *(undefined1 *)((long)local_28 + 0xd) = 0;
    if ((((local_40 & 1) != 0) &&
        (*(undefined1 *)((long)local_30 + 0x19) = 1, (*(byte *)(local_30 + 6) & 1) != 0)) &&
       ((local_40 & 2) == 0)) {
      *(byte *)((long)local_28 + 0xd) = *(byte *)((long)local_28 + 0xd) | 1;
    }
    if ((local_40 & 4) != 0) {
      if (*(long *)(local_10 + 0x9d0) == 0) {
        return -0x386;
      }
      *(undefined1 *)((long)local_30 + 0x1a) = 1;
    }
    *local_28 = local_48;
    local_28[2] = 0;
    frame_00 = (nghttp2_frame *)nghttp2_min_size(local_20,*local_28 + 0x100);
    nVar2 = session_call_select_padding
                      (session_00,frame_00,CONCAT44(iVar4,in_stack_ffffffffffffff98));
    iVar1 = nghttp2_is_fatal((int)nVar2);
    local_4 = (int)nVar2;
    if (iVar1 == 0) {
      local_28[2] = nVar2 - local_48;
      nghttp2_frame_pack_frame_hd((uint8_t *)in_stack_ffffffffffffff90,(nghttp2_frame_hd *)pnVar3);
      nghttp2_frame_add_pad
                ((nghttp2_bufs *)&frame_00->hd,
                 (nghttp2_frame_hd *)CONCAT44(iVar4,in_stack_ffffffffffffff98),
                 (size_t)in_stack_ffffffffffffff90,(int)((ulong)pnVar3 >> 0x20));
      session_reschedule_stream(in_stack_ffffffffffffff90,pnVar3);
      if (((*local_28 == 0) && ((local_40 & 1) != 0)) && ((local_40 & 2) != 0)) {
        local_4 = -0x217;
      }
      else {
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int nghttp2_session_pack_data(nghttp2_session *session, nghttp2_bufs *bufs,
                              size_t datamax, nghttp2_frame *frame,
                              nghttp2_data_aux_data *aux_data,
                              nghttp2_stream *stream) {
  int rv;
  uint32_t data_flags;
  nghttp2_ssize payloadlen;
  nghttp2_ssize padded_payloadlen;
  nghttp2_buf *buf;
  size_t max_payloadlen;

  assert(bufs->head == bufs->cur);

  buf = &bufs->cur->buf;

  if (session->callbacks.read_length_callback2 ||
      session->callbacks.read_length_callback) {
    if (session->callbacks.read_length_callback2) {
      payloadlen = session->callbacks.read_length_callback2(
        session, frame->hd.type, stream->stream_id, session->remote_window_size,
        stream->remote_window_size, session->remote_settings.max_frame_size,
        session->user_data);
    } else {
      payloadlen = (nghttp2_ssize)session->callbacks.read_length_callback(
        session, frame->hd.type, stream->stream_id, session->remote_window_size,
        stream->remote_window_size, session->remote_settings.max_frame_size,
        session->user_data);
    }

    DEBUGF("send: read_length_callback=%td\n", payloadlen);

    payloadlen =
      nghttp2_session_enforce_flow_control_limits(session, stream, payloadlen);

    DEBUGF("send: read_length_callback after flow control=%td\n", payloadlen);

    if (payloadlen <= 0) {
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    }

    if ((size_t)payloadlen > nghttp2_buf_avail(buf)) {
      /* Resize the current buffer(s).  The reason why we do +1 for
         buffer size is for possible padding field. */
      rv = nghttp2_bufs_realloc(&session->aob.framebufs,
                                (size_t)(NGHTTP2_FRAME_HDLEN + 1 + payloadlen));

      if (rv != 0) {
        DEBUGF("send: realloc buffer failed rv=%d", rv);
        /* If reallocation failed, old buffers are still in tact.  So
           use safe limit. */
        payloadlen = (nghttp2_ssize)datamax;

        DEBUGF("send: use safe limit payloadlen=%td", payloadlen);
      } else {
        assert(&session->aob.framebufs == bufs);

        buf = &bufs->cur->buf;
      }
    }
    datamax = (size_t)payloadlen;
  }

  /* Current max DATA length is less then buffer chunk size */
  assert(nghttp2_buf_avail(buf) >= datamax);

  data_flags = NGHTTP2_DATA_FLAG_NONE;
  switch (aux_data->dpw.version) {
  case NGHTTP2_DATA_PROVIDER_V1:
    payloadlen = (nghttp2_ssize)aux_data->dpw.data_prd.v1.read_callback(
      session, frame->hd.stream_id, buf->pos, datamax, &data_flags,
      &aux_data->dpw.data_prd.source, session->user_data);

    break;
  case NGHTTP2_DATA_PROVIDER_V2:
    payloadlen = aux_data->dpw.data_prd.v2.read_callback(
      session, frame->hd.stream_id, buf->pos, datamax, &data_flags,
      &aux_data->dpw.data_prd.source, session->user_data);

    break;
  default:
    assert(0);
    abort();
  }

  if (payloadlen == NGHTTP2_ERR_DEFERRED ||
      payloadlen == NGHTTP2_ERR_TEMPORAL_CALLBACK_FAILURE ||
      payloadlen == NGHTTP2_ERR_PAUSE) {
    DEBUGF("send: DATA postponed due to %s\n",
           nghttp2_strerror((int)payloadlen));

    return (int)payloadlen;
  }

  if (payloadlen < 0 || datamax < (size_t)payloadlen) {
    /* This is the error code when callback is failed. */
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  }

  buf->last = buf->pos + payloadlen;
  buf->pos -= NGHTTP2_FRAME_HDLEN;

  /* Clear flags, because this may contain previous flags of previous
     DATA */
  frame->hd.flags = NGHTTP2_FLAG_NONE;

  if (data_flags & NGHTTP2_DATA_FLAG_EOF) {
    aux_data->eof = 1;
    /* If NGHTTP2_DATA_FLAG_NO_END_STREAM is set, don't set
       NGHTTP2_FLAG_END_STREAM */
    if ((aux_data->flags & NGHTTP2_FLAG_END_STREAM) &&
        (data_flags & NGHTTP2_DATA_FLAG_NO_END_STREAM) == 0) {
      frame->hd.flags |= NGHTTP2_FLAG_END_STREAM;
    }
  }

  if (data_flags & NGHTTP2_DATA_FLAG_NO_COPY) {
    if (session->callbacks.send_data_callback == NULL) {
      DEBUGF("NGHTTP2_DATA_FLAG_NO_COPY requires send_data_callback set\n");

      return NGHTTP2_ERR_CALLBACK_FAILURE;
    }
    aux_data->no_copy = 1;
  }

  frame->hd.length = (size_t)payloadlen;
  frame->data.padlen = 0;

  max_payloadlen =
    nghttp2_min_size(datamax, frame->hd.length + NGHTTP2_MAX_PADLEN);

  padded_payloadlen =
    session_call_select_padding(session, frame, max_payloadlen);

  if (nghttp2_is_fatal((int)padded_payloadlen)) {
    return (int)padded_payloadlen;
  }

  frame->data.padlen = (size_t)(padded_payloadlen - payloadlen);

  nghttp2_frame_pack_frame_hd(buf->pos, &frame->hd);

  nghttp2_frame_add_pad(bufs, &frame->hd, frame->data.padlen,
                        aux_data->no_copy);

  session_reschedule_stream(session, stream);

  if (frame->hd.length == 0 && (data_flags & NGHTTP2_DATA_FLAG_EOF) &&
      (data_flags & NGHTTP2_DATA_FLAG_NO_END_STREAM)) {
    /* DATA payload length is 0, and DATA frame does not bear
       END_STREAM.  In this case, there is no point to send 0 length
       DATA frame. */
    return NGHTTP2_ERR_CANCEL;
  }

  return 0;
}